

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O2

string * __thiscall Point::ToString_abi_cxx11_(string *__return_storage_ptr__,Point *this)

{
  ostream *poVar1;
  ostringstream local_198 [8];
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->mX);
  poVar1 = std::operator<<(poVar1," , ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->mY);
  std::operator<<(poVar1,"]");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string Point::ToString()
{
    std::ostringstream oss;
    oss << "[" << mX << " , " << mY << "]";
    return oss.str();
}